

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtesteventloop.cpp
# Opt level: O0

void QTestEventLoop::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QTestEventLoop *in_RDI;
  QTestEventLoop *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    exitLoop(in_RDI);
  }
  return;
}

Assistant:

void QTestEventLoop::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTestEventLoop *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->exitLoop(); break;
        default: ;
        }
    }
    (void)_a;
}